

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O0

void __thiscall Refal2::CScanner::preprocessingStringAfterBackslash(CScanner *this,char c)

{
  char cVar1;
  bool bVar2;
  char c_local;
  CScanner *this_local;
  
  this->preprocessingState = PS_String;
  cVar1 = (char)this;
  switch(c) {
  case '\\':
    std::__cxx11::string::push_back(cVar1 + -0x50);
    break;
  default:
    bVar2 = IsOctal(c);
    if (bVar2) {
      this->octalCodeOne = c;
      this->preprocessingState = PS_StringOctalCodeOne;
    }
    else {
      std::__cxx11::string::push_back(cVar1 + -0x50);
      preprocessing(this,c);
    }
    break;
  case 'b':
    std::__cxx11::string::push_back(cVar1 + -0x50);
    break;
  case 'f':
    std::__cxx11::string::push_back(cVar1 + -0x50);
    break;
  case 'n':
    std::__cxx11::string::push_back(cVar1 + -0x50);
    break;
  case 'r':
    std::__cxx11::string::push_back(cVar1 + -0x50);
    break;
  case 't':
    std::__cxx11::string::push_back(cVar1 + -0x50);
    break;
  case 'v':
    std::__cxx11::string::push_back(cVar1 + -0x50);
  }
  return;
}

Assistant:

void CScanner::preprocessingStringAfterBackslash( char c )
{
	preprocessingState = PS_String;
	switch( c ) {
		case 'n':
			token.word.push_back( LineFeed );
			break;
		case 't':
			token.word.push_back( HorizontalTabulation );
			break;
		case 'v':
			token.word.push_back( '\v' );
			break;
		case 'b':
			token.word.push_back( '\b' );
			break;
		case 'r':
			token.word.push_back( CarriageReturn );
			break;
		case 'f':
			token.word.push_back( '\f' );
			break;
		case Backslash:
			token.word.push_back( Backslash );
			break;
		default:
			if( IsOctal( c ) ) {
				octalCodeOne = c;
				preprocessingState = PS_StringOctalCodeOne;
			} else {
				token.word.push_back( Backslash );
				preprocessing( c );
			}
			break;
	}
}